

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManCheckTopoOrder(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  uint local_20;
  int local_1c;
  int RetValue;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 1;
  Gia_ManFillValue(p);
  pGVar3 = Gia_ManConst0(p);
  pGVar3->Value = 0;
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar4 = false;
    if (local_1c < iVar1) {
      _RetValue = Gia_ManCi(p,local_1c);
      bVar4 = _RetValue != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    _RetValue->Value = 0;
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar4 = false;
    if (local_1c < iVar1) {
      _RetValue = Gia_ManCo(p,local_1c);
      bVar4 = _RetValue != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    pGVar3 = Gia_ObjFanin0(_RetValue);
    uVar2 = Gia_ManCheckTopoOrder_rec(p,pGVar3);
    local_20 = uVar2 & local_20;
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Gia_ManCheckTopoOrder( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, RetValue = 1;
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        RetValue &= Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin0(pObj) );
    return RetValue;
}